

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  string local_c8;
  sigaction sa;
  
  progname = *argv;
  iVar1 = getopt(argc,argv,"vh");
  if (iVar1 == -1) {
    memset(&sa,0,0x98);
    sigemptyset((sigset_t *)&sa.sa_mask);
    sa.__sigaction_handler.sa_handler = segfault_sigaction;
    sa.sa_flags = 4;
    sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
    std::__cxx11::string::string((string *)&local_c8,"",&local_e9);
    std::__cxx11::string::string((string *)&local_e8,"",&local_ea);
    initstreams(&local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    doit();
    return 0;
  }
  if (iVar1 == 0x76) {
    fprintf(_stderr,"%s : version: %s\n",*argv,"");
  }
  else {
    help();
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];
	int opt;

	while ((opt = getopt(argc, argv, "vh")) != -1) {
		switch (opt) {
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
		doit();
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "%s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}

	return EXIT_SUCCESS;

}